

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_alloc.c
# Opt level: O3

light_option light_alloc_option(uint16_t option_length)

{
  light_option p_Var1;
  uint32_t *puVar2;
  ushort uVar3;
  
  p_Var1 = (light_option)calloc(1,0x18);
  p_Var1->option_length = option_length;
  uVar3 = option_length + 3 & 0xfffc;
  if (uVar3 != 0) {
    puVar2 = (uint32_t *)calloc(1,(ulong)uVar3);
    p_Var1->data = puVar2;
  }
  return p_Var1;
}

Assistant:

light_option light_alloc_option(uint16_t option_length)
{
	struct _light_option *option = calloc(1, sizeof(struct _light_option));
	uint16_t actual_size = 0;

	option->option_length = option_length;

	PADD32(option_length, &actual_size);
	if (actual_size != 0) {
		option->data = calloc(1, actual_size);
	}

	return option;
}